

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O3

uint __thiscall Kernel::Signature::getBoolSort(Signature *this)

{
  Symbol *this_00;
  uint uVar1;
  TermList TVar2;
  OperatorKey *key;
  OperatorType *type;
  bool added;
  bool local_41;
  string local_40;
  
  local_41 = false;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"$o","");
  uVar1 = addTypeCon(this,&local_40,0,&local_41);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_41 == true) {
    this_00 = (this->_typeCons)._stack[uVar1];
    TVar2 = AtomicSort::superSort();
    key = OperatorType::setupKey(0,(TermList *)0x0);
    *(uint64_t *)(key + 8) = TVar2._content;
    type = OperatorType::getTypeFromKey(key,0);
    Symbol::setType(this_00,type);
  }
  return uVar1;
}

Assistant:

unsigned getBoolSort(){
    bool added = false;
    unsigned boolSort = addTypeCon("$o",0, added);
    if(added){
      getTypeCon(boolSort)->setType(OperatorType::getConstantsType(AtomicSort::superSort()));
    }
    return boolSort;
  }